

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall
QListWidgetPrivate::emitItemDoubleClicked(QListWidgetPrivate *this,QModelIndex *index)

{
  QModelIndex *in_RSI;
  QListWidgetPrivate *in_RDI;
  QListWidget *q;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  q_func(in_RDI);
  listModel((QListWidgetPrivate *)0x89ce9a);
  QModelIndex::row(in_RSI);
  QListModel::at((QListModel *)in_RDI,in_stack_ffffffffffffffcc);
  QListWidget::itemDoubleClicked
            ((QListWidget *)0x89cec2,
             (QListWidgetItem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void QListWidgetPrivate::emitItemDoubleClicked(const QModelIndex &index)
{
    Q_Q(QListWidget);
    emit q->itemDoubleClicked(listModel()->at(index.row()));
}